

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

uint32_t bestasize(uint32_t *bins,uint32_t *narray)

{
  byte bVar1;
  uint32_t nn;
  uint32_t sz;
  uint32_t na;
  uint32_t sum;
  uint32_t b;
  uint32_t *narray_local;
  uint32_t *bins_local;
  
  na = 0;
  sz = 0;
  b = 0;
  sum = 0;
  while (bVar1 = (byte)b, (uint)(1 << (bVar1 & 0x1f)) < *narray << 1 && sum != *narray) {
    if ((bins[b] != 0) && (sum = bins[b] + sum, (uint)(1 << (bVar1 & 0x1f)) < sum * 2)) {
      sz = (2 << (bVar1 & 0x1f)) + 1;
      na = sum;
    }
    b = b + 1;
  }
  *narray = sz;
  return na;
}

Assistant:

static uint32_t bestasize(uint32_t bins[], uint32_t *narray)
{
  uint32_t b, sum, na = 0, sz = 0, nn = *narray;
  for (b = 0, sum = 0; 2*nn > (1u<<b) && sum != nn; b++)
    if (bins[b] > 0 && 2*(sum += bins[b]) > (1u<<b)) {
      sz = (2u<<b)+1;
      na = sum;
    }
  *narray = sz;
  return na;
}